

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O2

void __thiscall MTRand::reload(MTRand *this)

{
  uint32 uVar1;
  int iVar2;
  MTRand *s0;
  
  s0 = this;
  for (iVar2 = -0xe3; iVar2 != 0; iVar2 = iVar2 + 1) {
    uVar1 = twist(this,s0->state + 0x18d,s0->state,s0->state + 1);
    s0->state[0] = uVar1;
    s0 = (MTRand *)(s0->state + 1);
  }
  for (iVar2 = -0x18c; iVar2 != 0; iVar2 = iVar2 + 1) {
    uVar1 = twist(this,s0[-1].state + 399,s0->state,s0->state + 1);
    s0->state[0] = uVar1;
    s0 = (MTRand *)(s0->state + 1);
  }
  uVar1 = twist(this,s0[-1].state + 399,s0->state,this->state);
  s0->state[0] = uVar1;
  this->left = 0x270;
  this->pNext = this->state;
  return;
}

Assistant:

void MTRand::reload() {
  // Generate N new values in state
  // Made clearer and faster by Matthew Bellew (matthew.bellew@home.com)
  uint32 *p = state;
  int i;
  for (i = N - M; i--; ++p)
    *p = twist(p[M], p[0], p[1]);
  for (i = M; --i; ++p)
    *p = twist(p[M - N], p[0], p[1]);
  *p = twist(p[M - N], p[0], state[0]);

  left = N, pNext = state;
}